

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

Vec_Int_t * Gia_VtaFramesToAbs(Vec_Vec_t *vFrames)

{
  void *pvVar1;
  Vec_Int_t *p;
  int *piVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  iVar6 = vFrames->nSize;
  if ((long)iVar6 < 1) {
    iVar7 = 0;
  }
  else {
    lVar4 = 0;
    iVar7 = 0;
    do {
      iVar7 = iVar7 + *(int *)((long)vFrames->pArray[lVar4] + 4);
      lVar4 = lVar4 + 1;
    } while (iVar6 != lVar4);
  }
  p = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < (iVar6 + 2 + iVar7) - 1U) {
    iVar3 = iVar6 + 2 + iVar7;
  }
  p->nSize = 0;
  p->nCap = iVar3;
  if (iVar3 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar3 << 2);
  }
  p->pArray = piVar2;
  Vec_IntPush(p,iVar6);
  iVar6 = vFrames->nSize + 2;
  if (0 < vFrames->nSize) {
    lVar4 = 0;
    do {
      pvVar1 = vFrames->pArray[lVar4];
      Vec_IntPush(p,iVar6);
      iVar6 = iVar6 + *(int *)((long)pvVar1 + 4);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vFrames->nSize);
  }
  Vec_IntPush(p,iVar6);
  if (p->nSize != vFrames->nSize + 2) {
    __assert_fail("Vec_IntSize(vAbs) == Vec_VecSize(vFrames) + 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                  ,0xc1,"Vec_Int_t *Gia_VtaFramesToAbs(Vec_Vec_t *)");
  }
  if (0 < vFrames->nSize) {
    lVar4 = 0;
    do {
      pvVar1 = vFrames->pArray[lVar4];
      if (0 < *(int *)((long)pvVar1 + 4)) {
        lVar8 = 0;
        do {
          Vec_IntPush(p,*(int *)(*(long *)((long)pvVar1 + 8) + lVar8 * 4));
          lVar8 = lVar8 + 1;
        } while (lVar8 < *(int *)((long)pvVar1 + 4));
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < vFrames->nSize);
  }
  iVar6 = p->nSize;
  if (0 < iVar6) {
    iVar7 = *p->pArray;
    if ((-2 < iVar7) && (uVar5 = iVar7 + 1, (int)uVar5 < iVar6)) {
      if (p->pArray[uVar5] != iVar6) {
        __assert_fail("Vec_IntEntry(vAbs, Vec_IntEntry(vAbs,0)+1) == Vec_IntSize(vAbs)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                      ,0xc5,"Vec_Int_t *Gia_VtaFramesToAbs(Vec_Vec_t *)");
      }
      return p;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Gia_VtaFramesToAbs( Vec_Vec_t * vFrames )
{
    Vec_Int_t * vOne, * vAbs;
    int i, k, Entry, nSize;
    vAbs = Vec_IntAlloc( 2 + Vec_VecSize(vFrames) + Vec_VecSizeSize(vFrames) );
    Vec_IntPush( vAbs, Vec_VecSize(vFrames) );
    nSize = Vec_VecSize(vFrames) + 2;
    Vec_VecForEachLevelInt( vFrames, vOne, i )
    {
        Vec_IntPush( vAbs, nSize );
        nSize += Vec_IntSize( vOne );
    }
    Vec_IntPush( vAbs, nSize );
    assert( Vec_IntSize(vAbs) == Vec_VecSize(vFrames) + 2 );
    Vec_VecForEachLevelInt( vFrames, vOne, i )
        Vec_IntForEachEntry( vOne, Entry, k )
            Vec_IntPush( vAbs, Entry );
    assert( Vec_IntEntry(vAbs, Vec_IntEntry(vAbs,0)+1) == Vec_IntSize(vAbs) );
    return vAbs;
}